

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaTargetGenerator *this,cmNinjaVars *vars)

{
  cmGeneratorTarget *pcVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  string *psVar5;
  ulong uVar6;
  cmLocalNinjaGenerator *pcVar7;
  mapped_type *pmVar8;
  bool bVar9;
  allocator local_231;
  key_type local_230;
  string local_210;
  string local_1f0;
  allocator local_1c9;
  key_type local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  string compilePdbPath;
  string pdbPath;
  string local_80;
  allocator local_49;
  string local_48;
  cmMakefile *local_28;
  cmMakefile *mf;
  cmNinjaVars *vars_local;
  cmNinjaTargetGenerator *this_local;
  
  mf = (cmMakefile *)vars;
  vars_local = (cmNinjaVars *)this;
  pcVar3 = GetMakefile(this);
  local_28 = pcVar3;
  std::allocator<char>::allocator();
  pdbPath.field_2._M_local_buf[0xe] = '\0';
  pdbPath.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string((string *)&local_48,"MSVC_C_ARCHITECTURE_ID",&local_49);
  pcVar4 = cmMakefile::GetDefinition(pcVar3,&local_48);
  pcVar3 = local_28;
  bVar9 = true;
  if (pcVar4 == (char *)0x0) {
    std::allocator<char>::allocator();
    pdbPath.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string
              ((string *)&local_80,"MSVC_CXX_ARCHITECTURE_ID",
               (allocator *)(pdbPath.field_2._M_local_buf + 0xf));
    pdbPath.field_2._M_local_buf[0xd] = '\x01';
    pcVar4 = cmMakefile::GetDefinition(pcVar3,&local_80);
    bVar9 = pcVar4 != (char *)0x0;
  }
  if ((pdbPath.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((pdbPath.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(pdbPath.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar9) {
    std::__cxx11::string::string((string *)(compilePdbPath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_c8);
    TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar2 == EXECUTABLE) ||
         (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar2 == STATIC_LIBRARY)) ||
        (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar2 == SHARED_LIBRARY)) ||
       (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar2 == MODULE_LIBRARY)) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBDirectory(&local_e8,pcVar1,psVar5);
      std::__cxx11::string::operator=
                ((string *)(compilePdbPath.field_2._M_local_buf + 8),(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::operator+=((string *)(compilePdbPath.field_2._M_local_buf + 8),"/");
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBName(&local_108,pcVar1,psVar5);
      std::__cxx11::string::operator+=
                ((string *)(compilePdbPath.field_2._M_local_buf + 8),(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
    TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((int)TVar2 < 5) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetCompilePDBPath(&local_128,pcVar1,psVar5);
      std::__cxx11::string::operator=((string *)local_c8,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                  (&local_168,(this->super_cmCommonTargetGenerator).GeneratorTarget);
        std::operator+(&local_148,&local_168,"/");
        std::__cxx11::string::operator=((string *)local_c8,(string *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
      }
    }
    pcVar7 = GetLocalGenerator(this);
    ConvertToNinjaPath(&local_1a8,this,(string *)((long)&compilePdbPath.field_2 + 8));
    cmOutputConverter::ConvertToOutputFormat
              (&local_188,
               &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_1a8,SHELL);
    pcVar3 = mf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"TARGET_PDB",&local_1c9);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pcVar3,&local_1c8);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    pcVar7 = GetLocalGenerator(this);
    ConvertToNinjaPath(&local_210,this,(string *)local_c8);
    cmOutputConverter::ConvertToOutputFormat
              (&local_1f0,
               &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_210,SHELL);
    pcVar3 = mf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"TARGET_COMPILE_PDB",&local_231);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pcVar3,&local_230);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    EnsureParentDirectoryExists(this,(string *)((long)&compilePdbPath.field_2 + 8));
    EnsureParentDirectoryExists(this,(string *)local_c8);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)(compilePdbPath.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaVars& vars) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID"))
    {
    std::string pdbPath;
    std::string compilePdbPath;
    if(this->GeneratorTarget->GetType() == cmState::EXECUTABLE ||
       this->GeneratorTarget->GetType() == cmState::STATIC_LIBRARY ||
       this->GeneratorTarget->GetType() == cmState::SHARED_LIBRARY ||
       this->GeneratorTarget->GetType() == cmState::MODULE_LIBRARY)
      {
      pdbPath = this->GeneratorTarget->GetPDBDirectory(this->GetConfigName());
      pdbPath += "/";
      pdbPath += this->GeneratorTarget->GetPDBName(this->GetConfigName());
      }
    if(this->GeneratorTarget->GetType() <= cmState::OBJECT_LIBRARY)
      {
      compilePdbPath =
              this->GeneratorTarget->GetCompilePDBPath(this->GetConfigName());
      if(compilePdbPath.empty())
        {
        compilePdbPath = this->GeneratorTarget->GetSupportDirectory() + "/";
        }
      }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
                          ConvertToNinjaPath(pdbPath),
                          cmLocalGenerator::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ConvertToNinjaPath(compilePdbPath),
        cmLocalGenerator::SHELL);

    EnsureParentDirectoryExists(pdbPath);
    EnsureParentDirectoryExists(compilePdbPath);
    return true;
    }
  return false;
}